

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriter.cpp
# Opt level: O2

uint64_t __thiscall
MILBlob::Blob::StorageWriter::Impl::WriteData<MILBlob::UInt2>
          (Impl *this,Span<const_MILBlob::UInt2,_18446744073709551615UL> data)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  runtime_error *this_00;
  SpanSize<18446744073709551615UL> extraout_RDX;
  Span<const_MILBlob::UInt2,_18446744073709551615UL> span;
  Span<const_MILBlob::UInt2,_18446744073709551615UL> span_00;
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  Span<const_unsigned_char,_18446744073709551615UL> SVar4;
  type local_68 [8];
  size_t local_60;
  uint64_t local_58;
  long local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  span.m_size = data.m_size.m_size;
  local_68[0] = 0xef;
  local_68[1] = 0xbe;
  local_68[2] = 0xad;
  local_68[3] = 0xde;
  local_68[4] = '\n';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  span.m_ptr = (type)span.m_size.m_size;
  SVar4 = Util::CastFromBitSpan<const_MILBlob::UInt2,_true>((Util *)data.m_ptr,span);
  local_60 = (size_t)SVar4.m_size.m_size;
  uVar1 = (int)data.m_size.m_size * 2 & 6;
  local_50 = 0;
  if (uVar1 != 0) {
    local_50 = 8 - (ulong)uVar1;
  }
  uVar2 = FileWriter::GetNextAlignedOffset
                    ((this->m_fileWriter)._M_t.
                     super___uniq_ptr_impl<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_MILBlob::Blob::FileWriter_*,_std::default_delete<MILBlob::Blob::FileWriter>_>
                     .super__Head_base<0UL,_MILBlob::Blob::FileWriter_*,_false>._M_head_impl);
  if ((uVar2 & 0x3f) == 0) {
    SVar4.m_size.m_size = 0x40;
    SVar4.m_ptr = local_68;
    local_58 = uVar2 + 0x40;
    uVar3 = FileWriter::AppendData
                      ((this->m_fileWriter)._M_t.
                       super___uniq_ptr_impl<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_MILBlob::Blob::FileWriter_*,_std::default_delete<MILBlob::Blob::FileWriter>_>
                       .super__Head_base<0UL,_MILBlob::Blob::FileWriter_*,_false>._M_head_impl,SVar4
                      );
    if (uVar2 == uVar3) {
      span_00.m_size.m_size = extraout_RDX.m_size;
      span_00.m_ptr = (type)span.m_size.m_size;
      SVar4 = Util::CastFromBitSpan<const_MILBlob::UInt2,_true>((Util *)data.m_ptr,span_00);
      uVar3 = FileWriter::AppendData
                        ((this->m_fileWriter)._M_t.
                         super___uniq_ptr_impl<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_MILBlob::Blob::FileWriter_*,_std::default_delete<MILBlob::Blob::FileWriter>_>
                         .super__Head_base<0UL,_MILBlob::Blob::FileWriter_*,_false>._M_head_impl,
                         SVar4);
      if (uVar2 + 0x40 == uVar3) {
        (this->m_header).count = (this->m_header).count + 1;
        data_00.m_size.m_size = 0x40;
        data_00.m_ptr = (pointer)&this->m_header;
        FileWriter::WriteData
                  ((this->m_fileWriter)._M_t.
                   super___uniq_ptr_impl<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_MILBlob::Blob::FileWriter_*,_std::default_delete<MILBlob::Blob::FileWriter>_>
                   .super__Head_base<0UL,_MILBlob::Blob::FileWriter_*,_false>._M_head_impl,data_00,0
                  );
        return uVar2;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"[MIL StorageWriter]: Metadata written to different offset than expected.")
      ;
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"[MIL StorageWriter]: Metadata written to different offset than expected.")
      ;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"[MIL StorageWriter]: dataOffset is expected to be 64 bits aligned.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t StorageWriter::Impl::WriteData(Util::Span<const T> data)
{
    // 1. Write data
    blob_metadata metadata;
    metadata.mil_dtype = BlobDataTypeTraits<typename std::remove_const<T>::type>::DataType;
    metadata.sizeInBytes = SpanSizeInBytes(data);

    // populate padding_size_in_bits, if we're writing a sub-byte-sized type
    WritePaddingBits<std::remove_cv_t<T>>(metadata, data.Size());

    // Get offset for data
    auto metadataOffset = m_fileWriter->GetNextAlignedOffset();
    // metadata is 64 bit aligned.
    auto dataOffset = metadataOffset + sizeof(metadata);
    MILVerifyIsTrue(dataOffset % DefaultStorageAlignment == 0,
                    std::runtime_error,
                    "[MIL StorageWriter]: dataOffset is expected to be 64 bits aligned.");
    metadata.offset = dataOffset;
    // We don't expect m_fileWriter to produce different offset for metadata and data
    auto actualMetadataOffset = m_fileWriter->AppendData(CastAndMakeSpan(metadata));
    MILVerifyIsTrue(metadataOffset == actualMetadataOffset,
                    std::runtime_error,
                    "[MIL StorageWriter]: Metadata written to different offset than expected.");
    Util::Span<const uint8_t> byteSpan;
    if constexpr (MILBlob::IsSubByteSized<T>::value) {
        byteSpan = Util::CastFromBitSpan(data);
    } else {
        byteSpan = Util::SpanCast<const uint8_t>(data);
    }
    auto actualDataOffset = m_fileWriter->AppendData(byteSpan);
    MILVerifyIsTrue(dataOffset == actualDataOffset,
                    std::runtime_error,
                    "[MIL StorageWriter]: Metadata written to different offset than expected.");

    // 2. Update count in header
    m_header.count++;
    // Write header with new count
    m_fileWriter->WriteData(CastAndMakeSpan(m_header), 0);
    // return offset in file to blob_metadata
    return metadataOffset;
}